

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

bool __thiscall pbrt::Triangle::IntersectP(Triangle *this,Ray *ray,Float tMax)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  Tuple3<pbrt::Point3,_float> local_48;
  Tuple3<pbrt::Point3,_float> local_38;
  Tuple3<pbrt::Point3,_float> local_28;
  optional<pbrt::TriangleIntersection> local_1c;
  
  lVar1 = allMeshes;
  *(long *)(in_FS_OFFSET + -0x4b0) = *(long *)(in_FS_OFFSET + -0x4b0) + 1;
  lVar1 = *(long *)(*(long *)(lVar1 + 8) + (long)this->meshIndex * 8);
  lVar2 = (long)this->triIndex;
  lVar4 = *(long *)(lVar1 + 8);
  lVar1 = *(long *)(lVar1 + 0x10);
  lVar3 = (long)*(int *)(lVar4 + lVar2 * 0xc);
  local_28.z = *(float *)(lVar1 + 8 + lVar3 * 0xc);
  local_28._0_8_ = *(undefined8 *)(lVar1 + lVar3 * 0xc);
  lVar3 = (long)*(int *)(lVar4 + 4 + lVar2 * 0xc);
  local_38.z = *(float *)(lVar1 + 8 + lVar3 * 0xc);
  local_38._0_8_ = *(undefined8 *)(lVar1 + lVar3 * 0xc);
  lVar4 = (long)*(int *)(lVar4 + 8 + lVar2 * 0xc);
  local_48.z = *(float *)(lVar1 + 8 + lVar4 * 0xc);
  local_48._0_8_ = *(undefined8 *)(lVar1 + lVar4 * 0xc);
  IntersectTriangle(&local_1c,ray,tMax,(Point3f *)&local_28,(Point3f *)&local_38,
                    (Point3f *)&local_48);
  if (local_1c.set == true) {
    *(long *)(in_FS_OFFSET + -0x4a8) = *(long *)(in_FS_OFFSET + -0x4a8) + 1;
  }
  return local_1c.set;
}

Assistant:

bool Triangle::IntersectP(const Ray &ray, Float tMax) const {
#ifndef PBRT_IS_GPU_CODE
    ++nTriTests;
#endif
    // Get triangle vertices in _p0_, _p1_, and _p2_
    const TriangleMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

    pstd::optional<TriangleIntersection> isect = IntersectTriangle(ray, tMax, p0, p1, p2);
    if (isect) {
#ifndef PBRT_IS_GPU_CODE
        ++nTriHits;
#endif
        return true;
    } else
        return false;
}